

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O3

int mbedtls_net_connect(mbedtls_net_context *ctx,char *host,char *port,int proto)

{
  int iVar1;
  int iVar2;
  addrinfo *paVar3;
  addrinfo *addr_list;
  addrinfo *local_60;
  addrinfo local_58;
  
  signal(0xd,(__sighandler_t)0x1);
  local_58.ai_protocol = 6;
  if (proto == 1) {
    local_58.ai_protocol = 0x11;
  }
  local_58.ai_flags = 0;
  local_58.ai_family = 0;
  local_58.ai_canonname = (char *)0x0;
  local_58.ai_next = (addrinfo *)0x0;
  local_58.ai_addrlen = 0;
  local_58._20_4_ = 0;
  local_58.ai_addr = (sockaddr *)0x0;
  local_58.ai_socktype = (proto == 1) + 1;
  iVar1 = getaddrinfo(host,port,&local_58,&local_60);
  iVar2 = -0x52;
  if (iVar1 == 0) {
    paVar3 = local_60;
    if (local_60 == (addrinfo *)0x0) {
      local_60 = (addrinfo *)0x0;
    }
    else {
      do {
        iVar1 = socket(paVar3->ai_family,paVar3->ai_socktype,paVar3->ai_protocol);
        ctx->fd = iVar1;
        if (iVar1 < 0) {
          iVar2 = -0x42;
        }
        else {
          iVar1 = connect(iVar1,paVar3->ai_addr,paVar3->ai_addrlen);
          if (iVar1 == 0) {
            iVar2 = 0;
            break;
          }
          close(ctx->fd);
          iVar2 = -0x44;
        }
        paVar3 = paVar3->ai_next;
      } while (paVar3 != (addrinfo *)0x0);
    }
    freeaddrinfo(local_60);
  }
  return iVar2;
}

Assistant:

int mbedtls_net_connect( mbedtls_net_context *ctx, const char *host, const char *port, int proto )
{
    int ret;
    struct addrinfo hints, *addr_list, *cur;

    if( ( ret = net_prepare() ) != 0 )
        return( ret );

    /* Do name resolution with both IPv6 and IPv4 */
    memset( &hints, 0, sizeof( hints ) );
    hints.ai_family = AF_UNSPEC;
    hints.ai_socktype = proto == MBEDTLS_NET_PROTO_UDP ? SOCK_DGRAM : SOCK_STREAM;
    hints.ai_protocol = proto == MBEDTLS_NET_PROTO_UDP ? IPPROTO_UDP : IPPROTO_TCP;

    if( getaddrinfo( host, port, &hints, &addr_list ) != 0 )
        return( MBEDTLS_ERR_NET_UNKNOWN_HOST );

    /* Try the sockaddrs until a connection succeeds */
    ret = MBEDTLS_ERR_NET_UNKNOWN_HOST;
    for( cur = addr_list; cur != NULL; cur = cur->ai_next )
    {
        ctx->fd = (int) socket( cur->ai_family, cur->ai_socktype,
                            cur->ai_protocol );
        if( ctx->fd < 0 )
        {
            ret = MBEDTLS_ERR_NET_SOCKET_FAILED;
            continue;
        }

        if( connect( ctx->fd, cur->ai_addr, MSVC_INT_CAST cur->ai_addrlen ) == 0 )
        {
            ret = 0;
            break;
        }

        close( ctx->fd );
        ret = MBEDTLS_ERR_NET_CONNECT_FAILED;
    }

    freeaddrinfo( addr_list );

    return( ret );
}